

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall cs_impl::fiber::Ordinator::~Ordinator(Ordinator *this)

{
  pointer ppRVar1;
  Routine *this_00;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *__range2;
  Routine **routine;
  pointer ppRVar4;
  
  ppRVar1 = (this->routines).
            super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar4 = (this->routines).
                 super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar4 != ppRVar1;
      ppRVar4 = ppRVar4 + 1) {
    this_00 = *ppRVar4;
    if (this_00 != (Routine *)0x0) {
      Routine::~Routine(this_00);
    }
    operator_delete(this_00,0x438);
  }
  p_Var3 = (this->indexes).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->indexes) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  ppRVar4 = (this->routines).
            super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 == (pointer)0x0) {
    return;
  }
  operator_delete(ppRVar4,(long)(this->routines).
                                super__Vector_base<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar4);
  return;
}

Assistant:

inline ~Ordinator()
			{
				for (auto &routine: routines)
					delete routine;
			}